

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

int txt_sentence(char *dest,int sd)

{
  int iVar1;
  size_t sVar2;
  char *target;
  undefined4 in_ESI;
  char *in_RDI;
  bool bVar3;
  int len;
  int res;
  int i;
  char *cptr;
  char syntax [13];
  char *in_stack_ffffffffffffffc0;
  int iVar4;
  int iVar5;
  uint in_stack_ffffffffffffffd4;
  char *local_28;
  char local_19 [5];
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  char *local_8;
  
  iVar5 = 0;
  iVar4 = 0;
  pick_str((distribution *)((ulong)in_stack_ffffffffffffffd4 << 0x20),0,in_stack_ffffffffffffffc0);
  local_28 = local_19;
  local_8 = in_RDI;
  while( true ) {
    while( true ) {
      bVar3 = false;
      if (*local_28 != '\0') {
        bVar3 = *local_28 == ' ';
      }
      if (!bVar3) break;
      local_28 = local_28 + 1;
    }
    if (*local_28 == '\0') break;
    target = (char *)(ulong)((int)*local_28 - 0x4e);
    switch(target) {
    case (char *)0x0:
      iVar4 = txt_np((char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
      break;
    case (char *)0x2:
      in_stack_ffffffffffffffd4 =
           pick_str((distribution *)CONCAT44(in_stack_ffffffffffffffd4,iVar5),iVar4,target);
      sVar2 = strlen(prepositions.list[(int)in_stack_ffffffffffffffd4].text);
      iVar1 = (int)sVar2;
      strcpy(local_8 + iVar1," the ");
      iVar1 = iVar1 + 5;
      iVar4 = txt_np((char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
      iVar4 = iVar4 + iVar1;
      break;
    case (char *)0x6:
      local_8 = local_8 + -1;
      in_stack_ffffffffffffffd4 =
           pick_str((distribution *)CONCAT44(in_stack_ffffffffffffffd4,iVar5),iVar4,target);
      sVar2 = strlen(terminators.list[(int)in_stack_ffffffffffffffd4].text);
      iVar4 = (int)sVar2;
      break;
    case (char *)0x8:
      iVar4 = txt_vp((char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
    }
    local_8 = local_8 + iVar4;
    iVar5 = iVar4 + iVar5;
    local_28 = local_28 + 1;
    if ((*local_28 != '\0') && (*local_28 != ' ')) {
      local_8 = local_8 + 1;
      iVar5 = iVar5 + 1;
      *local_8 = *local_28;
    }
  }
  *local_8 = '\0';
  return iVar5 + -1;
}

Assistant:

static int
txt_sentence(char *dest, int sd) 
{
	char syntax[MAX_GRAMMAR_LEN + 1],
		*cptr;
	int i,
		res = 0,
		len = 0;

	
	pick_str(&grammar, sd, syntax);
	cptr = syntax;

next_token:	/* I hate goto's, but can't seem to have parent and child use strtok() */
	while (*cptr && *cptr == ' ')
		cptr++;
	if (*cptr == '\0')
		goto done;
	switch(*cptr)
		{
		case 'V':
			len = txt_vp(dest, sd);
			break;
		case 'N': 
			len = txt_np(dest, sd);
			break;
		case 'P':
			i = pick_str(&prepositions, sd, dest);
			len = strlen(DIST_MEMBER(&prepositions, i));
			strcpy((dest + len), " the ");
			len += 5;
			len += txt_np(dest + len, sd);
			break;
		case 'T':
			i = pick_str(&terminators, sd, --dest); /*terminators should abut previous word */
			len = strlen(DIST_MEMBER(&terminators, i));
			break;
		}	/* end of POS switch statement */
		dest += len;
		res += len;
		cptr++;
		if (*cptr && *cptr != ' ')	/* miscelaneous fillagree, like punctuation */
		{
			dest += 1;
			res += 1;
			*dest = *cptr;
		}
		goto next_token;
done:
	*dest = '\0';
	return(--res);
}